

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::cast_bfloat16_to_float32(Mat *src,Mat *dst,Option *opt)

{
  Layer *pLVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ParamDict pd;
  Layer *cast;
  undefined8 in_stack_fffffffffffff6c8;
  ParamDict *in_stack_fffffffffffff6d0;
  undefined1 local_920 [32];
  ParamDict *in_stack_fffffffffffff700;
  
  pLVar1 = create_layer((int)((ulong)in_stack_fffffffffffff6c8 >> 0x20));
  ParamDict::ParamDict(in_stack_fffffffffffff700);
  ParamDict::set((ParamDict *)local_920,0,4);
  ParamDict::set((ParamDict *)local_920,1,1);
  (*pLVar1->_vptr_Layer[2])(pLVar1,local_920);
  (*pLVar1->_vptr_Layer[4])(pLVar1,in_RDX);
  (*pLVar1->_vptr_Layer[7])(pLVar1,in_RDI,in_RSI,in_RDX);
  (*pLVar1->_vptr_Layer[5])(pLVar1,in_RDX);
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(in_stack_fffffffffffff6d0);
  return;
}

Assistant:

void cast_bfloat16_to_float32(const Mat& src, Mat& dst, const Option& opt)
{
    Layer* cast = create_layer(LayerType::Cast);

    ParamDict pd;
    pd.set(0, 4);
    pd.set(1, 1);

    cast->load_param(pd);

    cast->create_pipeline(opt);

    cast->forward(src, dst, opt);

    cast->destroy_pipeline(opt);

    delete cast;
}